

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayCopy
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType destType,
          HeapType srcType)

{
  optional<wasm::HeapType> src;
  Err *pEVar1;
  ArrayCopy *pAVar2;
  bool bVar3;
  optional<wasm::HeapType> dest;
  Ok local_1a1;
  Err local_1a0;
  Err *local_180;
  Err *err_2;
  undefined1 local_170 [8];
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_118 [8];
  Result<wasm::Ok> _val_1;
  Err local_e8;
  Err *local_b8;
  Err *err;
  bool bStack_a8;
  undefined7 uStack_a7;
  undefined1 local_a0 [12];
  ChildPopper local_90;
  undefined1 local_88 [8];
  Result<wasm::Ok> _val;
  ArrayCopy curr;
  IRBuilder *this_local;
  HeapType srcType_local;
  HeapType destType_local;
  
  pAVar2 = (ArrayCopy *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  this_local = (IRBuilder *)srcType.id;
  srcType_local = destType;
  ArrayCopy::ArrayCopy(pAVar2);
  ChildPopper::ChildPopper(&local_90,this);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)local_a0,&srcType_local);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)&err,(HeapType *)&this_local);
  src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = bStack_a8;
  src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_7_ = uStack_a7;
  src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
  dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a0._0_8_;
  dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a0[8];
  dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a0._9_3_;
  ChildPopper::visitArrayCopy((Result<wasm::Ok> *)local_88,&local_90,pAVar2,dest,src);
  local_b8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_88);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_b8 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_e8,local_b8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e8);
    wasm::Err::~Err(&local_e8);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_88);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    anon_unknown_282::validateTypeAnnotation
              ((Result<wasm::Ok> *)local_118,srcType_local,
               (Expression *)
               curr.super_SpecificExpression<(wasm::Expression::Id)77>.super_Expression.type.id);
    pEVar1 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_118);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_118);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      err_2 = (Err *)this_local;
      anon_unknown_282::validateTypeAnnotation
                ((Result<wasm::Ok> *)local_170,(HeapType)this_local,curr.destIndex);
      local_180 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_170);
      bVar3 = local_180 != (Err *)0x0;
      if (bVar3) {
        wasm::Err::Err(&local_1a0,local_180);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1a0);
        wasm::Err::~Err(&local_1a0);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_170);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        pAVar2 = Builder::makeArrayCopy
                           (&this->builder,
                            (Expression *)
                            curr.super_SpecificExpression<(wasm::Expression::Id)77>.super_Expression
                            .type.id,curr.destRef,curr.destIndex,curr.srcRef,curr.srcIndex);
        push(this,(Expression *)pAVar2);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1a1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayCopy(HeapType destType, HeapType srcType) {
  ArrayCopy curr;
  CHECK_ERR(ChildPopper{*this}.visitArrayCopy(&curr, destType, srcType));
  CHECK_ERR(validateTypeAnnotation(destType, curr.destRef));
  CHECK_ERR(validateTypeAnnotation(srcType, curr.srcRef));
  push(builder.makeArrayCopy(
    curr.destRef, curr.destIndex, curr.srcRef, curr.srcIndex, curr.length));
  return Ok{};
}